

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

void eddsa_openssh_blob(ssh_key *key,BinarySink *bs)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  strbuf *buf_o;
  strbuf *buf_o_00;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  
  if (*(int *)&(key[-3].vt)->new_pub == 2) {
    buf_o = strbuf_new();
    BinarySink_put_epoint
              (buf_o->binarysink_,(EdwardsPoint *)key[-2].vt,(ec_curve *)key[-3].vt,false);
    pcVar2 = buf_o->s;
    sVar3 = buf_o->len;
    sVar1 = sVar3 - 4;
    buf_o_00 = strbuf_new_nm();
    BinarySink_put_mp_le_fixedlen
              (buf_o_00->binarysink_,(mp_int *)key[-1].vt,(size_t)(key[-3].vt)->invalid);
    pcVar4 = buf_o_00->s;
    sVar5 = buf_o_00->len;
    pl.len = sVar1;
    pl.ptr = pcVar2 + 4;
    BinarySink_put_stringpl(bs->binarysink_,pl);
    BinarySink_put_uint32(bs->binarysink_,(sVar3 + sVar5) - 8);
    pl_00.len = sVar5 - 4;
    pl_00.ptr = pcVar4 + 4;
    BinarySink_put_datapl(bs->binarysink_,pl_00);
    pl_01.len = sVar1;
    pl_01.ptr = pcVar2 + 4;
    BinarySink_put_datapl(bs->binarysink_,pl_01);
    strbuf_free(buf_o);
    strbuf_free(buf_o_00);
    return;
  }
  __assert_fail("ek->curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x37c,"void eddsa_openssh_blob(ssh_key *, BinarySink *)");
}

Assistant:

static void eddsa_openssh_blob(ssh_key *key, BinarySink *bs)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    assert(ek->curve->type == EC_EDWARDS);

    /* Encode the public and private points as strings */
    strbuf *pub_sb = strbuf_new();
    put_epoint(pub_sb, ek->publicKey, ek->curve, false);
    ptrlen pub = make_ptrlen(pub_sb->s + 4, pub_sb->len - 4);

    strbuf *priv_sb = strbuf_new_nm();
    put_mp_le_fixedlen(priv_sb, ek->privateKey, ek->curve->fieldBytes);
    ptrlen priv = make_ptrlen(priv_sb->s + 4, priv_sb->len - 4);

    put_stringpl(bs, pub);

    /* Encode the private key as the concatenation of the
     * little-endian key integer and the public key again */
    put_uint32(bs, priv.len + pub.len);
    put_datapl(bs, priv);
    put_datapl(bs, pub);

    strbuf_free(pub_sb);
    strbuf_free(priv_sb);
}